

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O1

int dwarf_next_cu_header_e
              (Dwarf_Debug dbg,Dwarf_Bool is_info,Dwarf_Die *cu_die_out,
              Dwarf_Unsigned *cu_header_length,Dwarf_Half *version_stamp,
              Dwarf_Unsigned *abbrev_offset,Dwarf_Half *address_size,Dwarf_Half *offset_size,
              Dwarf_Half *extension_size,Dwarf_Sig8 *signature,Dwarf_Unsigned *typeoffset,
              Dwarf_Unsigned *next_cu_offset,Dwarf_Half *header_cu_type,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Bool has_signature;
  Dwarf_Bool local_24;
  
  local_24 = 0;
  iVar1 = _dwarf_next_cu_header_internal
                    (dbg,is_info,cu_die_out,cu_header_length,version_stamp,abbrev_offset,
                     address_size,offset_size,extension_size,signature,&local_24,typeoffset,
                     next_cu_offset,header_cu_type,error);
  if (dbg->de_debug_addr_version == 0) {
    dbg->de_debug_addr_version = *version_stamp;
    dbg->de_debug_addr_offset_size = *offset_size;
    dbg->de_debug_addr_address_size = *address_size;
  }
  return iVar1;
}

Assistant:

int
dwarf_next_cu_header_e(Dwarf_Debug dbg,
    Dwarf_Bool is_info,
    Dwarf_Die  * cu_die_out,
    Dwarf_Unsigned * cu_header_length,
    Dwarf_Half * version_stamp,
    Dwarf_Unsigned * abbrev_offset,
    Dwarf_Half * address_size,
    Dwarf_Half * offset_size,
    Dwarf_Half * extension_size,
    Dwarf_Sig8 * signature,
    Dwarf_Unsigned * typeoffset,
    Dwarf_Unsigned * next_cu_offset,
    Dwarf_Half * header_cu_type,
    Dwarf_Error * error)
{
    Dwarf_Bool has_signature = FALSE;
    int res = 0;

    res = _dwarf_next_cu_header_internal(dbg,
        is_info,
        cu_die_out,
        cu_header_length,
        version_stamp,
        abbrev_offset,
        address_size,
        offset_size,
        extension_size,
        signature,
        &has_signature,
        typeoffset,
        next_cu_offset,
        header_cu_type,
        error);
    if (! dbg->de_debug_addr_version) {
        /*  To enable printing raw GNU extension .debug_addr */
        dbg->de_debug_addr_version = (Dwarf_Half)*version_stamp;
        dbg->de_debug_addr_offset_size = (Dwarf_Half)*offset_size;
        dbg->de_debug_addr_address_size = (Dwarf_Half)*address_size;
    }
    return res;
}